

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_init(_func_void *spmd_part,int argc,char **argv)

{
  Spmd *pSVar1;
  int pid;
  int mpi_init;
  int local_28;
  int local_24;
  char **local_20;
  int local_14;
  
  local_28 = -1;
  local_14 = 0;
  local_24 = argc;
  local_20 = argv;
  MPI_Initialized(&local_14);
  if (local_14 == 0) {
    MPI_Init(&local_24,&local_20);
    atexit(bsp_check_exit);
  }
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_init: May be called only once\n");
  }
  if (spmd_part == (_func_void *)0x0) {
    bsp_abort("bsp_init: Pointer to function must not point to NULL\n");
  }
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_28);
  if (local_28 < 1) {
    return;
  }
  (*spmd_part)();
  if (s_spmd == (Spmd *)0x0) {
    bsp_abort("bsp_init: spmd function did not contain SPMD section\n");
  }
  if (s_spmd->m_closed == false) {
    bsp_abort("bsp_init: spmd function did not end with call to bsp_end\n");
    if (s_spmd == (Spmd *)0x0) {
      pSVar1 = (Spmd *)0x0;
      goto LAB_00105c92;
    }
  }
  pSVar1 = s_spmd;
  bsplib::Spmd::~Spmd(s_spmd);
LAB_00105c92:
  operator_delete(pSVar1,0x28);
  s_spmd = (Spmd *)0x0;
  exit(0);
}

Assistant:

void bsp_init( void (*spmd_part)(void), int argc, char *argv[])
{
    int pid = -1;
    int mpi_init = 0;
    MPI_Initialized(&mpi_init);
    if (!mpi_init) {
        MPI_Init(&argc, &argv);
        atexit( bsp_check_exit );
    }

    if (s_spmd)
        bsp_abort( "bsp_init: May be called only once\n" );

    if (!spmd_part)
        bsp_abort( "bsp_init: Pointer to function must not point to NULL\n");

    MPI_Comm_rank( MPI_COMM_WORLD, &pid );
    if (pid > 0) {
        (*spmd_part)();

        if (!s_spmd)
            bsp_abort("bsp_init: spmd function did not contain SPMD section\n");

        if (!s_spmd->closed())
            bsp_abort("bsp_init: spmd function did not end with call to bsp_end\n");

        delete s_spmd;
        s_spmd = NULL;
        std::exit(EXIT_SUCCESS);
    }
}